

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O0

bool AreInputsStandard(CTransaction *tx,CCoinsViewCache *mapInputs)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  first;
  bool bVar1;
  TxoutType TVar2;
  size_type sVar3;
  const_reference pvVar4;
  uint flags;
  long in_FS_OFFSET;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *in_stack_00000010;
  CScript *in_stack_00000018;
  TxoutType whichType;
  CTxOut *prev;
  uint i;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  stack;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  vSolutions;
  CScript subscript;
  CScript *in_stack_fffffffffffffee8;
  COutPoint *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  SigVersion in_stack_ffffffffffffff0c;
  BaseSignatureChecker *checker;
  CScript *script;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  uint local_7c;
  byte local_61;
  undefined1 local_60 [88];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = CTransaction::IsCoinBase
                    ((CTransaction *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
  if (bVar1) {
    local_61 = 1;
  }
  else {
    for (local_7c = 0;
        sVar3 = std::vector<CTxIn,_std::allocator<CTxIn>_>::size
                          ((vector<CTxIn,_std::allocator<CTxIn>_> *)in_stack_fffffffffffffee8),
        local_7c < sVar3; local_7c = local_7c + 1) {
      std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 (size_type)in_stack_fffffffffffffef0);
      CCoinsViewCache::AccessCoin
                ((CCoinsViewCache *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef0);
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *)in_stack_fffffffffffffee8);
      TVar2 = Solver(in_stack_00000018,in_stack_00000010);
      if ((TVar2 == NONSTANDARD) || (TVar2 == WITNESS_UNKNOWN)) {
        local_61 = 0;
        bVar1 = true;
      }
      else {
        if (TVar2 == SCRIPTHASH) {
          checker = (BaseSignatureChecker *)(local_60 + 8);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_fffffffffffffee8);
          pvVar4 = std::vector<CTxIn,_std::allocator<CTxIn>_>::operator[]
                             ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                              CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                              (size_type)in_stack_fffffffffffffef0);
          flags = (uint)((ulong)&pvVar4->scriptSig >> 0x20);
          local_60._0_8_ = (char *)0x0;
          script = (CScript *)local_60;
          BaseSignatureChecker::BaseSignatureChecker
                    ((BaseSignatureChecker *)in_stack_fffffffffffffee8);
          in_stack_ffffffffffffff2f =
               EvalScript((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                           *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),script,
                          flags,checker,in_stack_ffffffffffffff0c,
                          (ScriptError *)in_stack_ffffffffffffff00._M_current);
          in_stack_ffffffffffffff0c =
               CONCAT13(in_stack_ffffffffffffff2f,(int3)in_stack_ffffffffffffff0c) ^ 0xff000000;
          BaseSignatureChecker::~BaseSignatureChecker
                    ((BaseSignatureChecker *)in_stack_fffffffffffffee8);
          if ((in_stack_ffffffffffffff0c & 0x1000000) == BASE) {
            bVar1 = std::
                    vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    ::empty((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
            if (bVar1) {
              local_61 = 0;
              bVar1 = true;
            }
            else {
              in_stack_ffffffffffffff00._M_current = local_60 + 8;
              std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_fffffffffffffee8);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffef0);
              std::
              vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
              ::back((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                      *)in_stack_fffffffffffffee8);
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                         in_stack_fffffffffffffef0);
              first._M_current._4_4_ = in_stack_ffffffffffffff0c;
              first._M_current._0_4_ = in_stack_ffffffffffffff08;
              CScript::
              CScript<__gnu_cxx::__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                        (in_stack_fffffffffffffee8,first,in_stack_ffffffffffffff00);
              in_stack_fffffffffffffefc =
                   CScript::GetSigOpCount
                             ((CScript *)
                              CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                              SUB81((ulong)in_stack_ffffffffffffff00._M_current >> 0x38,0));
              bVar1 = 0xf < in_stack_fffffffffffffefc;
              if (bVar1) {
                local_61 = 0;
              }
              CScript::~CScript(in_stack_fffffffffffffee8);
            }
          }
          else {
            local_61 = 0;
            bVar1 = true;
          }
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
          if (bVar1) goto LAB_006885be;
        }
        bVar1 = false;
      }
LAB_006885be:
      std::
      vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
      if (bVar1) goto LAB_00688606;
    }
    local_61 = 1;
  }
LAB_00688606:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (bool)(local_61 & 1);
}

Assistant:

bool AreInputsStandard(const CTransaction& tx, const CCoinsViewCache& mapInputs)
{
    if (tx.IsCoinBase()) {
        return true; // Coinbases don't use vin normally
    }

    for (unsigned int i = 0; i < tx.vin.size(); i++) {
        const CTxOut& prev = mapInputs.AccessCoin(tx.vin[i].prevout).out;

        std::vector<std::vector<unsigned char> > vSolutions;
        TxoutType whichType = Solver(prev.scriptPubKey, vSolutions);
        if (whichType == TxoutType::NONSTANDARD || whichType == TxoutType::WITNESS_UNKNOWN) {
            // WITNESS_UNKNOWN failures are typically also caught with a policy
            // flag in the script interpreter, but it can be helpful to catch
            // this type of NONSTANDARD transaction earlier in transaction
            // validation.
            return false;
        } else if (whichType == TxoutType::SCRIPTHASH) {
            std::vector<std::vector<unsigned char> > stack;
            // convert the scriptSig into a stack, so we can inspect the redeemScript
            if (!EvalScript(stack, tx.vin[i].scriptSig, SCRIPT_VERIFY_NONE, BaseSignatureChecker(), SigVersion::BASE))
                return false;
            if (stack.empty())
                return false;
            CScript subscript(stack.back().begin(), stack.back().end());
            if (subscript.GetSigOpCount(true) > MAX_P2SH_SIGOPS) {
                return false;
            }
        }
    }

    return true;
}